

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_prefix_coding.h
# Opt level: O1

bool __thiscall
lzham::prefix_coding::decoder_tables::assign(decoder_tables *this,decoder_tables *rhs)

{
  void *pvVar1;
  bool bVar2;
  uint uVar3;
  uint16 *__src;
  uint16 *puVar4;
  uint32 *puVar5;
  
  bVar2 = true;
  if (this == rhs) {
    return true;
  }
  if (this->m_malloc_context != rhs->m_malloc_context) {
    puVar5 = this->m_lookup;
    if (puVar5 != (uint32 *)0x0) {
      if ((puVar5[-2] ^ puVar5[-1]) == 0xffffffff) {
        lzham_free(this->m_malloc_context,puVar5 + -4);
      }
      this->m_lookup = (uint32 *)0x0;
      this->m_cur_lookup_size = 0;
    }
    puVar4 = this->m_sorted_symbol_order;
    if (puVar4 != (uint16 *)0x0) {
      if ((*(uint *)(puVar4 + -4) ^ *(uint *)(puVar4 + -2)) == 0xffffffff) {
        lzham_free(this->m_malloc_context,puVar4 + -8);
      }
      this->m_sorted_symbol_order = (uint16 *)0x0;
      this->m_cur_sorted_symbol_order_size = 0;
    }
    this->m_malloc_context = rhs->m_malloc_context;
  }
  puVar5 = this->m_lookup;
  puVar4 = this->m_sorted_symbol_order;
  memcpy(this,rhs,200);
  if (((puVar4 == (uint16 *)0x0 || puVar5 == (uint32 *)0x0) ||
      (rhs->m_cur_lookup_size != this->m_cur_lookup_size)) ||
     (rhs->m_cur_sorted_symbol_order_size != this->m_cur_sorted_symbol_order_size)) {
    if ((puVar5 != (uint32 *)0x0) && ((puVar5[-2] ^ puVar5[-1]) == 0xffffffff)) {
      lzham_free(this->m_malloc_context,puVar5 + -4);
    }
    this->m_lookup = (uint32 *)0x0;
    if (rhs->m_lookup == (uint32 *)0x0) {
LAB_0011627c:
      if ((puVar4 != (uint16 *)0x0) &&
         ((*(uint *)(puVar4 + -4) ^ *(uint *)(puVar4 + -2)) == 0xffffffff)) {
        lzham_free(this->m_malloc_context,puVar4 + -8);
      }
      this->m_sorted_symbol_order = (uint16 *)0x0;
      if (rhs->m_sorted_symbol_order == (uint16 *)0x0) {
        return true;
      }
      uVar3 = this->m_cur_sorted_symbol_order_size +
              (uint)(this->m_cur_sorted_symbol_order_size == 0);
      puVar4 = (uint16 *)0x0;
      pvVar1 = lzham_malloc(this->m_malloc_context,(ulong)uVar3 * 2 + 0x10,(size_t *)0x0);
      if (pvVar1 != (void *)0x0) {
        puVar4 = (uint16 *)((long)pvVar1 + 0x10);
        *(uint *)((long)pvVar1 + 0xc) = uVar3;
        *(uint *)((long)pvVar1 + 8) = ~uVar3;
      }
      this->m_sorted_symbol_order = puVar4;
      if (puVar4 != (uint16 *)0x0) {
        __src = rhs->m_sorted_symbol_order;
        uVar3 = this->m_cur_sorted_symbol_order_size;
        goto LAB_0011630f;
      }
    }
    else {
      uVar3 = this->m_cur_lookup_size + (uint)(this->m_cur_lookup_size == 0);
      puVar5 = (uint32 *)0x0;
      pvVar1 = lzham_malloc(this->m_malloc_context,(ulong)uVar3 * 4 + 0x10,(size_t *)0x0);
      if (pvVar1 != (void *)0x0) {
        puVar5 = (uint32 *)((long)pvVar1 + 0x10);
        *(uint *)((long)pvVar1 + 0xc) = uVar3;
        *(uint *)((long)pvVar1 + 8) = ~uVar3;
      }
      this->m_lookup = puVar5;
      if (puVar5 != (uint32 *)0x0) {
        memcpy(puVar5,rhs->m_lookup,(ulong)this->m_cur_lookup_size << 2);
        goto LAB_0011627c;
      }
    }
    bVar2 = false;
  }
  else {
    this->m_lookup = puVar5;
    this->m_sorted_symbol_order = puVar4;
    memcpy(puVar5,rhs->m_lookup,(ulong)this->m_cur_lookup_size << 2);
    puVar4 = this->m_sorted_symbol_order;
    __src = rhs->m_sorted_symbol_order;
    uVar3 = this->m_cur_sorted_symbol_order_size;
LAB_0011630f:
    memcpy(puVar4,__src,(ulong)uVar3 * 2);
  }
  return bVar2;
}

Assistant:

inline bool assign(const decoder_tables& rhs)
         {
            if (this == &rhs)
               return true;

            if (m_malloc_context != rhs.m_malloc_context)
            {
               clear();

               m_malloc_context = rhs.m_malloc_context;
            }

            uint32* pCur_lookup = m_lookup;
            uint16* pCur_sorted_symbol_order = m_sorted_symbol_order;

            memcpy(this, &rhs, sizeof(*this));

            if ((pCur_lookup) && (pCur_sorted_symbol_order) && (rhs.m_cur_lookup_size == m_cur_lookup_size) && (rhs.m_cur_sorted_symbol_order_size == m_cur_sorted_symbol_order_size))
            {
               m_lookup = pCur_lookup;
               m_sorted_symbol_order = pCur_sorted_symbol_order;

               memcpy(m_lookup, rhs.m_lookup, sizeof(m_lookup[0]) * m_cur_lookup_size);
               memcpy(m_sorted_symbol_order, rhs.m_sorted_symbol_order, sizeof(m_sorted_symbol_order[0]) * m_cur_sorted_symbol_order_size);
            }
            else
            {
               lzham_delete_array(m_malloc_context, pCur_lookup);
               m_lookup = NULL;

               if (rhs.m_lookup)
               {
                  m_lookup = lzham_new_array<uint32>(m_malloc_context, m_cur_lookup_size);
                  if (!m_lookup)
                     return false;
                  memcpy(m_lookup, rhs.m_lookup, sizeof(m_lookup[0]) * m_cur_lookup_size);
               }

               lzham_delete_array(m_malloc_context, pCur_sorted_symbol_order);
               m_sorted_symbol_order = NULL;

               if (rhs.m_sorted_symbol_order)
               {
                  m_sorted_symbol_order = lzham_new_array<uint16>(m_malloc_context, m_cur_sorted_symbol_order_size);
                  if (!m_sorted_symbol_order)
                     return false;
                  memcpy(m_sorted_symbol_order, rhs.m_sorted_symbol_order, sizeof(m_sorted_symbol_order[0]) * m_cur_sorted_symbol_order_size);
               }
            }

            return true;
         }